

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgstr(fitsfile *fptr,char *string,char *card,int *status)

{
  size_t sVar1;
  char *pcVar2;
  int local_48;
  int local_44;
  int kk;
  int jj;
  int stringlen;
  int ntodo;
  int nextkey;
  int nkeys;
  int *status_local;
  char *card_local;
  char *string_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    _nextkey = status;
    status_local = (int *)card;
    card_local = string;
    string_local = (char *)fptr;
    sVar1 = strlen(string);
    if ((int)sVar1 < 0x51) {
      ffghps((fitsfile *)string_local,&ntodo,&stringlen,_nextkey);
      jj = (ntodo - stringlen) + 1;
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < jj; local_48 = local_48 + 1) {
          ffgnky((fitsfile *)string_local,(char *)status_local,_nextkey);
          pcVar2 = strstr((char *)status_local,card_local);
          if (pcVar2 != (char *)0x0) {
            return *_nextkey;
          }
        }
        ffmaky((fitsfile *)string_local,1,_nextkey);
        jj = stringlen + -1;
      }
      *_nextkey = 0xca;
      fptr_local._4_4_ = 0xca;
    }
    else {
      *_nextkey = 0xca;
      fptr_local._4_4_ = 0xca;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgstr( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *string, /* I - string to match  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the next keyword record that contains the input character string,
  returning the entire keyword card up to 80 characters long.
  The returned card value is null terminated with any trailing blank 
  characters removed.
*/
{
    int nkeys, nextkey, ntodo, stringlen;
    int jj, kk;

    if (*status > 0)
        return(*status);

    stringlen = strlen(string);
    if (stringlen > 80) {
        return(*status = KEY_NO_EXIST);  /* matching string is too long to exist */
    }

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */

    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */
        if (strstr(card, string) != 0) {
            return(*status);   /* found the matching string */
        }
      }

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}